

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::
       doConvert(IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  bool *pbVar1;
  long lVar2;
  Interval local_40;
  
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  lVar2 = 0;
  do {
    tcu::FloatFormat::convert(&local_40,fmt,(Interval *)(&value->m_data[0].m_hasNaN + lVar2));
    *(double *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_40.m_hi;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_40._0_8_;
    *(double *)(pbVar1 + 8) = local_40.m_lo;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}